

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<ki::dml::Field<float>*,float>::load_impl_sequence<0ul,1ul>
          (argument_loader<ki::dml::Field<float>*,float> *this,long call)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 8),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
  type_caster<float,_void>::load
            ((type_caster<float,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 8),
             SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  if ((char)((ulong)uStack_18 >> 0x30) == '\x01') {
    lVar3 = 0;
    do {
      bVar2 = lVar3 == 1;
      if (bVar2) {
        return bVar2;
      }
      lVar1 = lVar3 + 7;
      lVar3 = lVar3 + 1;
    } while (*(char *)((long)&uStack_18 + lVar1) != '\0');
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }